

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIScrollBar.cpp
# Opt level: O0

bool __thiscall irr::gui::CGUIScrollBar::OnEvent(CGUIScrollBar *this,SEvent *event)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  s32 sVar4;
  ulong uVar5;
  int iVar6;
  int *in_RSI;
  CGUIScrollBar *in_RDI;
  SEvent newEvent_3;
  s32 oldPos_1;
  s32 newPos;
  SEvent newEvent_2;
  bool isInside;
  position2di p;
  SEvent newEvent_1;
  SEvent newEvent;
  bool absorb;
  s32 oldPos;
  SEvent *in_stack_fffffffffffffec8;
  IGUIElement *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 local_118 [4];
  undefined8 local_108;
  undefined4 local_100;
  s32 local_e0;
  s32 local_dc;
  undefined4 local_d8 [4];
  undefined8 local_c8;
  undefined4 local_c0;
  byte local_99;
  vector2d<int> local_98;
  undefined4 local_90 [4];
  undefined8 local_80;
  undefined4 local_78;
  undefined4 local_58 [4];
  undefined8 local_48;
  undefined4 local_40;
  byte local_1d;
  s32 local_1c;
  int *local_18;
  
  local_18 = in_RSI;
  uVar5 = (**(code **)(*(long *)in_RDI + 0x90))();
  if ((uVar5 & 1) != 0) {
    iVar2 = *local_18;
    if (iVar2 == 0) {
      if (local_18[6] == 5) {
        if (*(IGUIButton **)(local_18 + 2) == in_RDI->UpButton) {
          (**(code **)(*(long *)in_RDI + 0x168))(in_RDI,in_RDI->Pos - in_RDI->SmallStep);
        }
        else if (*(IGUIButton **)(local_18 + 2) == in_RDI->DownButton) {
          (**(code **)(*(long *)in_RDI + 0x168))(in_RDI,in_RDI->Pos + in_RDI->SmallStep);
        }
        local_90[0] = 0;
        local_80 = 0;
        local_78 = 6;
        (**(code **)(**(long **)&in_RDI->field_0x20 + 0x10))(*(long **)&in_RDI->field_0x20,local_90)
        ;
        return true;
      }
      if ((local_18[6] == 0) && (*(CGUIScrollBar **)(local_18 + 2) == in_RDI)) {
        in_RDI->Dragging = false;
      }
    }
    else if (iVar2 == 1) {
      core::vector2d<int>::vector2d(&local_98,local_18[2],local_18[3]);
      local_99 = (**(code **)(*(long *)in_RDI + 0x28))(in_RDI,&local_98);
      in_stack_fffffffffffffec8 = (SEvent *)(ulong)(uint)local_18[7];
      switch(in_stack_fffffffffffffec8) {
      case (SEvent *)0x0:
        if ((local_99 & 1) != 0) {
          in_RDI->Dragging = true;
          bVar1 = core::rect<int>::isPointInside(&in_RDI->SliderRect,&local_98);
          in_RDI->DraggedBySlider = bVar1;
          in_RDI->TrayClick = (bool)((in_RDI->DraggedBySlider ^ 0xffU) & 1);
          sVar4 = getPosFromMousePos(in_RDI,(position2di *)CONCAT44(iVar2,in_stack_fffffffffffffed8)
                                    );
          in_RDI->DesiredPos = sVar4;
          return true;
        }
        break;
      default:
        break;
      case (SEvent *)0x3:
      case (SEvent *)0x6:
        bVar1 = SEvent::SMouseInput::isLeftPressed((SMouseInput *)(local_18 + 2));
        if (!bVar1) {
          in_RDI->Dragging = false;
        }
        if ((in_RDI->Dragging & 1U) != 0) {
          if (local_18[7] == 3) {
            in_RDI->Dragging = false;
          }
          local_dc = getPosFromMousePos(in_RDI,(position2di *)
                                               CONCAT44(iVar2,in_stack_fffffffffffffed8));
          local_e0 = in_RDI->Pos;
          if ((in_RDI->DraggedBySlider & 1U) == 0) {
            if ((local_99 & 1) != 0) {
              bVar1 = core::rect<int>::isPointInside(&in_RDI->SliderRect,&local_98);
              in_RDI->DraggedBySlider = bVar1;
              in_RDI->TrayClick = (bool)((in_RDI->DraggedBySlider ^ 0xffU) & 1);
            }
            if ((in_RDI->DraggedBySlider & 1U) == 0) {
              in_RDI->TrayClick = false;
              if (local_18[7] == 6) {
                return (bool)(local_99 & 1);
              }
            }
            else {
              (**(code **)(*(long *)in_RDI + 0x168))(in_RDI,local_dc);
            }
          }
          if ((in_RDI->DraggedBySlider & 1U) == 0) {
            in_RDI->DesiredPos = local_dc;
          }
          else {
            (**(code **)(*(long *)in_RDI + 0x168))(in_RDI,local_dc);
          }
          if ((in_RDI->Pos != local_e0) && (*(long *)&in_RDI->field_0x20 != 0)) {
            local_118[0] = 0;
            local_108 = 0;
            local_100 = 6;
            (**(code **)(**(long **)&in_RDI->field_0x20 + 0x10))
                      (*(long **)&in_RDI->field_0x20,local_118);
          }
          return (bool)(local_99 & 1);
        }
        if (local_18[7] != 6) {
          return (bool)(local_99 & 1);
        }
        break;
      case (SEvent *)0x7:
        uVar5 = (**(code **)(**(long **)&in_RDI->field_0x128 + 0x28))
                          (*(long **)&in_RDI->field_0x128,in_RDI,0);
        if ((uVar5 & 1) != 0) {
          iVar2 = (**(code **)(*(long *)in_RDI + 0x160))();
          iVar3 = 1;
          if ((float)local_18[4] < 0.0) {
            iVar3 = -1;
          }
          iVar6 = -1;
          if ((in_RDI->Horizontal & 1U) != 0) {
            iVar6 = 1;
          }
          (**(code **)(*(long *)in_RDI + 0x168))(in_RDI,iVar2 + iVar3 * in_RDI->SmallStep * iVar6);
          local_d8[0] = 0;
          local_c8 = 0;
          local_c0 = 6;
          (**(code **)(**(long **)&in_RDI->field_0x20 + 0x10))
                    (*(long **)&in_RDI->field_0x20,local_d8);
          return true;
        }
      }
    }
    else if ((iVar2 == 2) && ((*(byte *)(local_18 + 5) & 1) != 0)) {
      local_1c = in_RDI->Pos;
      local_1d = 1;
      in_stack_fffffffffffffed0 = (IGUIElement *)(ulong)(local_18[3] - 0x21);
      switch(in_stack_fffffffffffffed0) {
      case (IGUIElement *)0x0:
        (**(code **)(*(long *)in_RDI + 0x168))(in_RDI,in_RDI->Pos - in_RDI->LargeStep);
        break;
      case (IGUIElement *)0x1:
        (**(code **)(*(long *)in_RDI + 0x168))(in_RDI,in_RDI->Pos + in_RDI->LargeStep);
        break;
      case (IGUIElement *)0x2:
        (**(code **)(*(long *)in_RDI + 0x168))(in_RDI,in_RDI->Max);
        break;
      case (IGUIElement *)0x3:
        (**(code **)(*(long *)in_RDI + 0x168))(in_RDI,in_RDI->Min);
        break;
      case (IGUIElement *)0x4:
      case (IGUIElement *)0x5:
        (**(code **)(*(long *)in_RDI + 0x168))(in_RDI,in_RDI->Pos - in_RDI->SmallStep);
        break;
      case (IGUIElement *)0x6:
      case (IGUIElement *)0x7:
        (**(code **)(*(long *)in_RDI + 0x168))(in_RDI,in_RDI->Pos + in_RDI->SmallStep);
        break;
      default:
        local_1d = 0;
      }
      if (in_RDI->Pos != local_1c) {
        local_58[0] = 0;
        local_48 = 0;
        local_40 = 6;
        (**(code **)(**(long **)&in_RDI->field_0x20 + 0x10))(*(long **)&in_RDI->field_0x20,local_58)
        ;
      }
      if ((local_1d & 1) != 0) {
        return true;
      }
    }
  }
  bVar1 = IGUIElement::OnEvent(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  return bVar1;
}

Assistant:

bool CGUIScrollBar::OnEvent(const SEvent &event)
{
	if (isEnabled()) {

		switch (event.EventType) {
		case EET_KEY_INPUT_EVENT:
			if (event.KeyInput.PressedDown) {
				const s32 oldPos = Pos;
				bool absorb = true;
				switch (event.KeyInput.Key) {
				case KEY_LEFT:
				case KEY_UP:
					setPos(Pos - SmallStep);
					break;
				case KEY_RIGHT:
				case KEY_DOWN:
					setPos(Pos + SmallStep);
					break;
				case KEY_HOME:
					setPos(Min);
					break;
				case KEY_PRIOR:
					setPos(Pos - LargeStep);
					break;
				case KEY_END:
					setPos(Max);
					break;
				case KEY_NEXT:
					setPos(Pos + LargeStep);
					break;
				default:
					absorb = false;
				}

				if (Pos != oldPos) {
					SEvent newEvent;
					newEvent.EventType = EET_GUI_EVENT;
					newEvent.GUIEvent.Caller = this;
					newEvent.GUIEvent.Element = 0;
					newEvent.GUIEvent.EventType = EGET_SCROLL_BAR_CHANGED;
					Parent->OnEvent(newEvent);
				}
				if (absorb)
					return true;
			}
			break;
		case EET_GUI_EVENT:
			if (event.GUIEvent.EventType == EGET_BUTTON_CLICKED) {
				if (event.GUIEvent.Caller == UpButton)
					setPos(Pos - SmallStep);
				else if (event.GUIEvent.Caller == DownButton)
					setPos(Pos + SmallStep);

				SEvent newEvent;
				newEvent.EventType = EET_GUI_EVENT;
				newEvent.GUIEvent.Caller = this;
				newEvent.GUIEvent.Element = 0;
				newEvent.GUIEvent.EventType = EGET_SCROLL_BAR_CHANGED;
				Parent->OnEvent(newEvent);

				return true;
			} else if (event.GUIEvent.EventType == EGET_ELEMENT_FOCUS_LOST) {
				if (event.GUIEvent.Caller == this)
					Dragging = false;
			}
			break;
		case EET_MOUSE_INPUT_EVENT: {
			const core::position2di p(event.MouseInput.X, event.MouseInput.Y);
			bool isInside = isPointInside(p);
			switch (event.MouseInput.Event) {
			case EMIE_MOUSE_WHEEL:
				if (Environment->hasFocus(this)) {
					// thanks to a bug report by REAPER
					// thanks to tommi by tommi for another bugfix
					// everybody needs a little thanking. hallo niko!;-)
					setPos(getPos() +
							((event.MouseInput.Wheel < 0 ? -1 : 1) * SmallStep * (Horizontal ? 1 : -1)));

					SEvent newEvent;
					newEvent.EventType = EET_GUI_EVENT;
					newEvent.GUIEvent.Caller = this;
					newEvent.GUIEvent.Element = 0;
					newEvent.GUIEvent.EventType = EGET_SCROLL_BAR_CHANGED;
					Parent->OnEvent(newEvent);
					return true;
				}
				break;
			case EMIE_LMOUSE_PRESSED_DOWN: {
				if (isInside) {
					Dragging = true;
					DraggedBySlider = SliderRect.isPointInside(p);
					TrayClick = !DraggedBySlider;
					DesiredPos = getPosFromMousePos(p);
					return true;
				}
				break;
			}
			case EMIE_LMOUSE_LEFT_UP:
			case EMIE_MOUSE_MOVED: {
				if (!event.MouseInput.isLeftPressed())
					Dragging = false;

				if (!Dragging) {
					if (event.MouseInput.Event == EMIE_MOUSE_MOVED)
						break;
					return isInside;
				}

				if (event.MouseInput.Event == EMIE_LMOUSE_LEFT_UP)
					Dragging = false;

				const s32 newPos = getPosFromMousePos(p);
				const s32 oldPos = Pos;

				if (!DraggedBySlider) {
					if (isInside) {
						DraggedBySlider = SliderRect.isPointInside(p);
						TrayClick = !DraggedBySlider;
					}

					if (DraggedBySlider) {
						setPos(newPos);
					} else {
						TrayClick = false;
						if (event.MouseInput.Event == EMIE_MOUSE_MOVED)
							return isInside;
					}
				}

				if (DraggedBySlider) {
					setPos(newPos);
				} else {
					DesiredPos = newPos;
				}

				if (Pos != oldPos && Parent) {
					SEvent newEvent;
					newEvent.EventType = EET_GUI_EVENT;
					newEvent.GUIEvent.Caller = this;
					newEvent.GUIEvent.Element = 0;
					newEvent.GUIEvent.EventType = EGET_SCROLL_BAR_CHANGED;
					Parent->OnEvent(newEvent);
				}
				return isInside;
			} break;

			default:
				break;
			}
		} break;
		default:
			break;
		}
	}

	return IGUIElement::OnEvent(event);
}